

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CMU462::Vertex::getAxes
          (Vertex *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  double dVar1;
  pointer pVVar2;
  _List_node_base *p_Var3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Vector3D local_30;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  normal(&local_30,this);
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2[2].z = local_30.z;
  pVVar2[2].x = local_30.x;
  pVVar2[2].y = local_30.y;
  p_Var3 = (this->_halfedge)._M_node[1]._M_prev[2]._M_prev;
  dVar5 = (double)p_Var3[2]._M_prev - (this->position).z;
  pVVar2 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pVVar2[2].z;
  dVar8 = (double)p_Var3[1]._M_prev - (this->position).x;
  dVar9 = (double)p_Var3[2]._M_next - (this->position).y;
  dVar6 = pVVar2[2].x;
  dVar7 = pVVar2[2].y;
  dVar10 = dVar5 * dVar1 + dVar8 * dVar6 + dVar9 * dVar7;
  dVar8 = dVar8 - dVar10 * dVar6;
  dVar9 = dVar9 - dVar10 * dVar7;
  dVar5 = dVar5 - dVar1 * dVar10;
  dVar10 = 1.0 / SQRT(dVar5 * dVar5 + dVar8 * dVar8 + dVar9 * dVar9);
  dVar5 = dVar5 * dVar10;
  dVar8 = dVar10 * dVar8;
  dVar10 = dVar10 * dVar9;
  pVVar2->x = dVar8;
  pVVar2->y = dVar10;
  pVVar2->z = dVar5;
  dVar9 = dVar5 * dVar7 - dVar10 * dVar1;
  dVar1 = dVar1 * dVar8 - dVar5 * dVar6;
  auVar4._8_4_ = SUB84(dVar1,0);
  auVar4._0_8_ = dVar9;
  auVar4._12_4_ = (int)((ulong)dVar1 >> 0x20);
  pVVar2[1].x = dVar9;
  pVVar2[1].y = (double)auVar4._8_8_;
  pVVar2[1].z = dVar10 * dVar6 - dVar7 * dVar8;
  return;
}

Assistant:

void Vertex::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the Z direction to the normal direction
    axes[2] = normal();

    // Use the first outgoing edge to pick an arbitrary X
    // direction, projecting out any component of the Z
    // direction chosen above
    Vector3D p0 = position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = p1 - p0;
    axes[0] -= dot( axes[0], axes[2] ) * axes[2];
    axes[0].normalize();

    // For the third axis, just take the cross product of
    // the first two, being careful to pick the order of the
    // cross product to satisfy the right-hand rule (i.e.,
    // so in the end we get X x Y = Z).
    axes[1] = cross( axes[2], axes[0] );
  }